

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::SharedDtor(TextClassifier *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->language_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->modelparameterdata_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if (this->_oneof_case_[0] != 0) {
    clear_ClassLabels(this);
    return;
  }
  return;
}

Assistant:

void TextClassifier::SharedDtor() {
  language_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  modelparameterdata_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}